

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O2

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  CommandLineParser *this_00;
  allocator local_53;
  anon_class_1_0_00000001_for_f local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,"collide",(allocator *)&local_30);
  TutorialApplication::TutorialApplication(&this->super_TutorialApplication,&local_50,1,0x200,0x200)
  ;
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_TutorialApplication).super_Application._vptr_Application =
       (_func_int **)&PTR__TutorialApplication_002aaa90;
  std::__cxx11::string::string((string *)&local_50,"benchmark-collision",&local_51);
  std::__cxx11::string::string
            ((string *)&local_30,"--benchmark-collision: benchmarks collision detection",&local_53);
  this_00 = &(this->super_TutorialApplication).super_Application.commandLineParser;
  CommandLineParser::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_1_>
            (this_00,&local_50,&local_52,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"complexity",&local_51);
  std::__cxx11::string::string
            ((string *)&local_30,"--complexity: sets grid and sphere geometric complexity",&local_53
            );
  CommandLineParser::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_2_>
            (this_00,&local_50,(anon_class_1_0_00000001_for_f *)&local_52,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined8 *)&(this->super_TutorialApplication).camera.from.field_0 = 0x40200000c0200000;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.from.field_0 + 8) = 0xc0200000;
  *(undefined8 *)&(this->super_TutorialApplication).camera.to.field_0 = 0;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.to.field_0 + 8) = 0;
  return;
}

Assistant:

Tutorial()
      : TutorialApplication("collide",FEATURE_RTCORE)
    {
      registerOption("benchmark-collision", [] (Ref<ParseStream> cin, const FileName& path) {
          benchmark = true;
        }, "--benchmark-collision: benchmarks collision detection");

      registerOption("complexity", [] (Ref<ParseStream> cin, const FileName& path) {
          int N = cin->getInt();
          numPhi = N;
          numTheta = 2*numPhi;
          NX = N;
          NZ = N;
        }, "--complexity: sets grid and sphere geometric complexity");
                       
      camera.from = Vec3fa(-2.5f,2.5f,-2.5f);
      camera.to   = Vec3fa(0.0f,0.0f,0.0f);
    }